

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O2

void ARM_getRegName(cs_struct *handle,int value)

{
  code *pcVar1;
  code *pcVar2;
  
  pcVar1 = getRegisterName;
  pcVar2 = ARM_reg_name;
  if (value == 3) {
    pcVar2 = ARM_reg_name2;
    pcVar1 = getRegisterName2;
  }
  handle->get_regname = pcVar1;
  handle->reg_name = pcVar2;
  return;
}

Assistant:

void ARM_getRegName(cs_struct *handle, int value)
{
	if (value == CS_OPT_SYNTAX_NOREGNAME) {
		handle->get_regname = getRegisterName2;
		handle->reg_name = ARM_reg_name2;;
	} else {
		handle->get_regname = getRegisterName;
		handle->reg_name = ARM_reg_name;;
	}
}